

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O3

void __thiscall CLASSWEIGHTS::classweights::load_string(classweights *this,string *source)

{
  int iVar1;
  char *pcVar2;
  char *__nptr;
  istream *piVar3;
  int *piVar4;
  long lVar5;
  mapped_type *pmVar6;
  vw_exception *this_00;
  undefined8 uVar7;
  long unaff_RBP;
  int iVar8;
  float fVar9;
  string weight;
  string klass;
  string item;
  stringstream __msg;
  stringstream ss;
  stringstream inner_ss;
  char *local_550;
  long local_548;
  char local_540 [16];
  char *local_530;
  long local_528;
  char local_520 [16];
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_510;
  char *local_508;
  long local_500;
  char local_4f8 [16];
  string local_4e8;
  undefined8 local_4c8;
  undefined1 local_4b8 [376];
  stringstream local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_510 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)this;
  std::__cxx11::stringstream::stringstream(local_340,(string *)source,_S_out|_S_in);
  local_508 = local_4f8;
  local_500 = 0;
  local_4f8[0] = '\0';
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_340,(string *)&local_508,',');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      if (local_508 != local_4f8) {
        operator_delete(local_508);
      }
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_508,_S_out|_S_in);
    local_528 = 0;
    local_520[0] = '\0';
    local_548 = 0;
    local_540[0] = '\0';
    local_550 = local_540;
    local_530 = local_520;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_1b8,(string *)&local_530,':');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_1b8,(string *)&local_550,':');
    __nptr = local_530;
    if ((local_528 == 0) || (local_548 == 0)) goto LAB_0021177b;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(__nptr,(char **)&local_4c8,10);
    pcVar2 = local_550;
    if ((char *)CONCAT44(local_4c8._4_4_,(key_type)local_4c8) == __nptr) {
      std::__throw_invalid_argument("stoi");
      lVar5 = unaff_RBP;
LAB_00211815:
      uVar7 = std::__throw_out_of_range("stof");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if ((char)lVar5 != '\0') {
        __cxa_free_exception(piVar4);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
      std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
      if (local_550 != local_540) {
        operator_delete(local_550);
      }
      if (local_530 != local_520) {
        operator_delete(local_530);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_508 != local_4f8) {
        operator_delete(local_508);
      }
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      _Unwind_Resume(uVar7);
    }
    if (((int)(key_type)lVar5 != lVar5) || (iVar8 = *piVar4, iVar8 == 0x22)) {
      std::__throw_out_of_range("stoi");
LAB_0021176f:
      std::__throw_invalid_argument("stof");
LAB_0021177b:
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4b8,"error: while parsing --classweight ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,local_508,local_500);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/classweight.cc"
                 ,0x1b,&local_4e8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (iVar8 == 0) {
      *piVar4 = iVar1;
      iVar8 = iVar1;
    }
    *piVar4 = 0;
    fVar9 = strtof(local_550,(char **)&local_4c8);
    if ((char *)CONCAT44(local_4c8._4_4_,(key_type)local_4c8) == pcVar2) goto LAB_0021176f;
    if (*piVar4 == 0) {
      *piVar4 = iVar8;
    }
    else if (*piVar4 == 0x22) goto LAB_00211815;
    local_4c8._0_4_ = (key_type)lVar5;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_510,(key_type *)&local_4c8);
    *pmVar6 = fVar9;
    if (local_550 != local_540) {
      operator_delete(local_550);
    }
    if (local_530 != local_520) {
      operator_delete(local_530);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    unaff_RBP = lVar5;
  } while( true );
}

Assistant:

void load_string(std::string const& source)
  {
    std::stringstream ss(source);
    std::string item;
    while (std::getline(ss, item, ','))
    {
      std::stringstream inner_ss(item);
      std::string klass;
      std::string weight;
      std::getline(inner_ss, klass, ':');
      std::getline(inner_ss, weight, ':');

      if (!klass.size() || !weight.size())
      {
        THROW("error: while parsing --classweight " << item);
      }

      int klass_int = std::stoi(klass);
      float weight_double = std::stof(weight);

      weights[klass_int] = weight_double;
    }
  }